

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

CloudNode * Cloud_MakeNode(CloudManager *dd,CloudVar v,CloudNode *t,CloudNode *e)

{
  CloudNode *local_30;
  CloudNode *pRes;
  CloudNode *e_local;
  CloudNode *t_local;
  CloudVar v_local;
  CloudManager *dd_local;
  
  if ((t < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= t)) {
    __assert_fail("(t) >= dd->tUnique && (t) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                  ,0x101,
                  "CloudNode *Cloud_MakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
  }
  if ((dd->tUnique <= e) && (e < dd->tUnique + dd->nNodesAlloc)) {
    if ((v < *(uint *)(((ulong)t & 0xfffffffffffffffe) + 4)) &&
       (v < *(uint *)(((ulong)e & 0xfffffffffffffffe) + 4))) {
      if (((ulong)t & 1) == 0) {
        local_30 = cloudMakeNode(dd,v,t,e);
      }
      else {
        local_30 = cloudMakeNode(dd,v,(CloudNode *)((ulong)t ^ 1),(CloudNode *)((ulong)e ^ 1));
        if (local_30 != (CloudNode *)0x0) {
          local_30 = (CloudNode *)((ulong)local_30 ^ 1);
        }
      }
      return local_30;
    }
    __assert_fail("v < Cloud_V(t) && v < Cloud_V(e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                  ,0x103,
                  "CloudNode *Cloud_MakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
  }
  __assert_fail("(e) >= dd->tUnique && (e) < dd->tUnique+dd->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                ,0x102,
                "CloudNode *Cloud_MakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
}

Assistant:

CloudNode * Cloud_MakeNode( CloudManager * dd, CloudVar v, CloudNode * t, CloudNode * e )
{
    CloudNode * pRes;
    CLOUD_ASSERT(t); 
    CLOUD_ASSERT(e);
    assert( v < Cloud_V(t) && v < Cloud_V(e) );       // variable should be above in the order
    if ( Cloud_IsComplement(t) )
    {
        pRes = cloudMakeNode( dd, v, Cloud_Not(t), Cloud_Not(e) );
        if ( pRes != NULL )
            pRes = Cloud_Not(pRes);            
    }
    else
        pRes = cloudMakeNode( dd, v, t, e );
    return pRes;
}